

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString __thiscall SimpleString::operator+(SimpleString *this,SimpleString *rhs)

{
  SimpleString *in_RDX;
  size_t extraout_RDX;
  SimpleString *in_RSI;
  SimpleString *in_RDI;
  SimpleString SVar1;
  SimpleString *t;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar2;
  
  uVar2 = 0;
  getBuffer(in_RSI);
  SimpleString(in_RDI,in_stack_ffffffffffffffb8);
  getBuffer(in_RDX);
  operator+=((SimpleString *)CONCAT17(uVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)in_RDI;
  return SVar1;
}

Assistant:

SimpleString SimpleString::operator+(const SimpleString& rhs) const
{
    SimpleString t(getBuffer());
    t += rhs.getBuffer();
    return t;
}